

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

int __thiscall List::binarySearch(List *this,char *key)

{
  Node **ppNVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar6;
  ulong uVar5;
  
  if (this->m_sorted == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"List doesn\'t sorted",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    uVar4 = 0xffffffff;
  }
  else {
    ppNVar1 = this->m_indexArray;
    uVar4 = this->m_listSize - 1;
    if (1 < this->m_listSize) {
      iVar3 = 0;
      uVar6 = (ulong)uVar4;
      do {
        uVar4 = (uint)((int)uVar6 + iVar3) >> 1;
        uVar5 = (ulong)uVar4;
        iVar2 = strncmp((ppNVar1[uVar5]->field_1).data.publishingHouse,key,3);
        if (iVar2 < 0) {
          iVar3 = uVar4 + 1;
          uVar5 = uVar6;
        }
        uVar4 = (uint)uVar5;
        uVar6 = uVar5;
      } while (iVar3 < (int)uVar4);
    }
    iVar3 = strncmp((ppNVar1[(int)uVar4]->field_1).data.publishingHouse,key,3);
    uVar4 = uVar4 | -(uint)(iVar3 != 0);
  }
  return uVar4;
}

Assistant:

int binarySearch(char *key) {
        if (!this->m_sorted) {
            cout << "List doesn't sorted" << endl;
            return -1;
        }
        Node **arr = m_indexArray;
        const int keySize = 3;
        int mid, left = 0, right = m_listSize - 1;
        while (left < right) {
            mid = (left + right) / 2;
            if (strncmp(arr[mid]->data.publishingHouse, key, keySize) < 0) {
                left = mid + 1;
            } else {
                right = mid;
            }
        }
        if (strncmp(arr[right]->data.publishingHouse, key, keySize) == 0) {
            return right;
        } else {
            return -1;
        }
    }